

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O2

int xs::runClient(int argc,char **argv)

{
  char *str;
  deBool dVar1;
  int iVar2;
  char *str_00;
  char *str_01;
  char *str_02;
  char *str_03;
  char *str_04;
  char *str_05;
  string *this;
  long lVar3;
  Client client;
  CommandLine cmdLine;
  
  CommandLine::CommandLine(&cmdLine);
  de::SocketAddress::setHost(&cmdLine.address,"127.0.0.1");
  de::SocketAddress::setPort(&cmdLine.address,0xc360);
  std::__cxx11::string::assign((char *)&cmdLine.dstFileName);
  lVar3 = 1;
  do {
    if (argc <= lVar3) {
      client.m_cmdLine = &cmdLine;
      de::Socket::Socket(&client.m_socket);
      Client::run(&client);
      de::Socket::~Socket(&client.m_socket);
      iVar2 = 0;
LAB_00107004:
      CommandLine::~CommandLine(&cmdLine);
      return iVar2;
    }
    str = argv[lVar3];
    dVar1 = deStringBeginsWith(str,"--port=");
    if (dVar1 == 0) {
      dVar1 = deStringBeginsWith(str,"--host=");
      if (dVar1 == 0) {
        dVar1 = deStringBeginsWith(str,"--program=");
        if (dVar1 == 0) {
          dVar1 = deStringBeginsWith(str,"--params=");
          if (dVar1 == 0) {
            dVar1 = deStringBeginsWith(str,"--workdir=");
            if (dVar1 == 0) {
              dVar1 = deStringBeginsWith(str,"--caselist=");
              if (dVar1 == 0) {
                dVar1 = deStringBeginsWith(str,"--out=");
                if (dVar1 == 0) {
                  printHelp(*argv);
                  iVar2 = -1;
                  goto LAB_00107004;
                }
                parseString_abi_cxx11_((string *)&client,(xs *)(str + 6),str_05);
                this = (string *)&cmdLine.dstFileName;
              }
              else {
                parseString_abi_cxx11_((string *)&client,(xs *)(str + 0xb),str_04);
                this = (string *)&cmdLine.caseList;
              }
            }
            else {
              parseString_abi_cxx11_((string *)&client,(xs *)(str + 10),str_03);
              this = (string *)&cmdLine.workingDir;
            }
          }
          else {
            parseString_abi_cxx11_((string *)&client,(xs *)(str + 9),str_02);
            this = (string *)&cmdLine.params;
          }
        }
        else {
          parseString_abi_cxx11_((string *)&client,(xs *)(str + 10),str_01);
          this = (string *)&cmdLine.program;
        }
        std::__cxx11::string::operator=(this,(string *)&client);
      }
      else {
        parseString_abi_cxx11_((string *)&client,(xs *)(str + 7),str_00);
        de::SocketAddress::setHost(&cmdLine.address,(char *)client.m_cmdLine);
      }
      std::__cxx11::string::~string((string *)&client);
    }
    else {
      iVar2 = atoi(str + 7);
      de::SocketAddress::setPort(&cmdLine.address,iVar2);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int runClient (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	// Defaults.
	cmdLine.address.setHost("127.0.0.1");
	cmdLine.address.setPort(50016);
	cmdLine.dstFileName = "TestResults.qpa";

	// Parse command line.
	for (int argNdx = 1; argNdx < argc; argNdx++)
	{
		const char* arg = argv[argNdx];

		if (deStringBeginsWith(arg, "--port="))
			cmdLine.address.setPort(atoi(arg+7));
		else if (deStringBeginsWith(arg, "--host="))
			cmdLine.address.setHost(parseString(arg+7).c_str());
		else if (deStringBeginsWith(arg, "--program="))
			cmdLine.program = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--params="))
			cmdLine.params = parseString(arg+9);
		else if (deStringBeginsWith(arg, "--workdir="))
			cmdLine.workingDir = parseString(arg+10);
		else if (deStringBeginsWith(arg, "--caselist="))
			cmdLine.caseList = parseString(arg+11);
		else if  (deStringBeginsWith(arg, "--out="))
			cmdLine.dstFileName = parseString(arg+6);
		else
		{
			printHelp(argv[0]);
			return -1;
		}
	}

	// Run client.
	try
	{
		Client client(cmdLine);
		client.run();
	}
	catch (const std::exception& e)
	{
		printf("%s\n", e.what());
		return -1;
	}

	return 0;
}